

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O0

CURLcode baller_connected(Curl_cfilter *cf,Curl_easy *data,cf_hc_baller *winner)

{
  uchar uVar1;
  undefined4 *puVar2;
  char *pcVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  uint uVar6;
  CURLcode CVar7;
  ulong uVar8;
  curltime cVar9;
  curltime newer;
  curltime older;
  CURLcode result;
  cf_hc_ctx *ctx;
  cf_hc_baller *winner_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  puVar2 = (undefined4 *)cf->ctx;
  if (winner != (cf_hc_baller *)(puVar2 + 10)) {
    cf_hc_baller_reset((cf_hc_baller *)(puVar2 + 10),data);
  }
  if (winner != (cf_hc_baller *)(puVar2 + 0x16)) {
    cf_hc_baller_reset((cf_hc_baller *)(puVar2 + 0x16),data);
  }
  if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) &&
      (cf != (Curl_cfilter *)0x0)) && (0 < cf->cft->log_level)) {
    pcVar3 = winner->name;
    cVar9 = Curl_now();
    uVar4 = (winner->started).tv_sec;
    uVar5 = (winner->started).tv_usec;
    older.tv_usec = uVar5;
    older.tv_sec = uVar4;
    newer._12_4_ = 0;
    newer.tv_sec = SUB128(cVar9._0_12_,0);
    newer.tv_usec = SUB124(cVar9._0_12_,8);
    older._12_4_ = 0;
    uVar8 = Curl_timediff(newer,older);
    uVar6 = cf_hc_baller_reply_ms(winner,data);
    Curl_trc_cf_infof(data,cf,"connect+handshake %s: %dms, 1st data: %dms",pcVar3,uVar8 & 0xffffffff
                      ,(ulong)uVar6);
  }
  cf->next = winner->cf;
  winner->cf = (Curl_cfilter *)0x0;
  uVar1 = cf->conn->alpn;
  if (uVar1 == '\x03') {
    CVar7 = Curl_http2_switch_at(cf,data);
    if (CVar7 != CURLE_OK) {
      *puVar2 = 3;
      puVar2[8] = CVar7;
      return CVar7;
    }
    if ((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) {
      Curl_infof(data,"using HTTP/2");
    }
  }
  else if (uVar1 == '\x1e') {
    if ((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) {
      Curl_infof(data,"using HTTP/3");
    }
  }
  else if ((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) {
    Curl_infof(data,"using HTTP/1.x");
  }
  *puVar2 = 2;
  cf->field_0x24 = cf->field_0x24 & 0xfe | 1;
  Curl_conn_cf_cntrl(cf->next,data,true,0x100,0,(void *)0x0);
  return CURLE_OK;
}

Assistant:

static CURLcode baller_connected(struct Curl_cfilter *cf,
                                 struct Curl_easy *data,
                                 struct cf_hc_baller *winner)
{
  struct cf_hc_ctx *ctx = cf->ctx;
  CURLcode result = CURLE_OK;

  DEBUGASSERT(winner->cf);
  if(winner != &ctx->h3_baller)
    cf_hc_baller_reset(&ctx->h3_baller, data);
  if(winner != &ctx->h21_baller)
    cf_hc_baller_reset(&ctx->h21_baller, data);

  CURL_TRC_CF(data, cf, "connect+handshake %s: %dms, 1st data: %dms",
              winner->name, (int)Curl_timediff(Curl_now(), winner->started),
              cf_hc_baller_reply_ms(winner, data));
  cf->next = winner->cf;
  winner->cf = NULL;

  switch(cf->conn->alpn) {
  case CURL_HTTP_VERSION_3:
    infof(data, "using HTTP/3");
    break;
  case CURL_HTTP_VERSION_2:
#ifdef USE_NGHTTP2
    /* Using nghttp2, we add the filter "below" us, so when the conn
     * closes, we tear it down for a fresh reconnect */
    result = Curl_http2_switch_at(cf, data);
    if(result) {
      ctx->state = CF_HC_FAILURE;
      ctx->result = result;
      return result;
    }
#endif
    infof(data, "using HTTP/2");
    break;
  default:
    infof(data, "using HTTP/1.x");
    break;
  }
  ctx->state = CF_HC_SUCCESS;
  cf->connected = TRUE;
  Curl_conn_cf_cntrl(cf->next, data, TRUE,
                     CF_CTRL_CONN_INFO_UPDATE, 0, NULL);
  return result;
}